

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

drmp3_bool32
drmp3_find_closest_seek_point(drmp3 *pMP3,drmp3_uint64 frameIndex,drmp3_uint32 *pSeekPointIndex)

{
  drmp3_bool32 dVar1;
  drmp3_uint64 *pdVar2;
  ulong uVar3;
  
  *pSeekPointIndex = 0;
  dVar1 = 0;
  if (pMP3->pSeekPoints->pcmFrameIndex <= frameIndex) {
    uVar3 = 0;
    dVar1 = 1;
    for (pdVar2 = &pMP3->pSeekPoints->pcmFrameIndex;
        (uVar3 < pMP3->seekPointCount && (*pdVar2 <= frameIndex)); pdVar2 = pdVar2 + 3) {
      *pSeekPointIndex = (drmp3_uint32)uVar3;
      uVar3 = uVar3 + 1;
    }
  }
  return dVar1;
}

Assistant:

drmp3_bool32 drmp3_find_closest_seek_point(drmp3* pMP3, drmp3_uint64 frameIndex, drmp3_uint32* pSeekPointIndex)
{
            drmp3_assert(pSeekPointIndex != NULL);

    *pSeekPointIndex = 0;

    if (frameIndex < pMP3->pSeekPoints[0].pcmFrameIndex) {
        return DRMP3_FALSE;
    }

    // Linear search for simplicity to begin with while I'm getting this thing working. Once it's all working change this to a binary search.
    for (drmp3_uint32 iSeekPoint = 0; iSeekPoint < pMP3->seekPointCount; ++iSeekPoint) {
        if (pMP3->pSeekPoints[iSeekPoint].pcmFrameIndex > frameIndex) {
            break;  // Found it.
        }

        *pSeekPointIndex = iSeekPoint;
    }

    return DRMP3_TRUE;
}